

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

_Bool tcg_out_mov(TCGContext_conflict9 *s,TCGType_conflict type,TCGReg ret,TCGReg arg)

{
  int local_28;
  int rexw;
  TCGReg arg_local;
  TCGReg ret_local;
  TCGType_conflict type_local;
  TCGContext_conflict9 *s_local;
  
  local_28 = 0;
  if (arg != ret) {
    switch(type) {
    case TCG_TYPE_I64:
      local_28 = 0x1000;
    case TCG_TYPE_I32:
      if (ret < TCG_REG_XMM0) {
        if (arg < TCG_REG_XMM0) {
          tcg_out_modrm(s,local_28 + 0x8b,ret,arg);
        }
        else {
          tcg_out_vex_modrm(s,local_28 + 0x57e,arg,0,ret);
        }
      }
      else if (arg < TCG_REG_XMM0) {
        tcg_out_vex_modrm(s,local_28 + 0x56e,ret,0,arg);
      }
      else {
        tcg_out_vex_modrm(s,0x2017e,ret,0,arg);
      }
      break;
    case TCG_TYPE_V64:
      tcg_out_vex_modrm(s,0x2017e,ret,0,arg);
      break;
    case TCG_TYPE_V128:
      tcg_out_vex_modrm(s,0x56f,ret,0,arg);
      break;
    case TCG_TYPE_V256:
      tcg_out_vex_modrm(s,0x8056f,ret,0,arg);
      break;
    default:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
                 ,0x36e,(char *)0x0);
    }
  }
  return true;
}

Assistant:

static bool tcg_out_mov(TCGContext *s, TCGType type, TCGReg ret, TCGReg arg)
{
    int rexw = 0;

    if (arg == ret) {
        return true;
    }
    switch (type) {
    case TCG_TYPE_I64:
        rexw = P_REXW;
        /* fallthru */
    case TCG_TYPE_I32:
        if (ret < 16) {
            if (arg < 16) {
                tcg_out_modrm(s, OPC_MOVL_GvEv + rexw, ret, arg);
            } else {
                tcg_out_vex_modrm(s, OPC_MOVD_EyVy + rexw, arg, 0, ret);
            }
        } else {
            if (arg < 16) {
                tcg_out_vex_modrm(s, OPC_MOVD_VyEy + rexw, ret, 0, arg);
            } else {
                tcg_out_vex_modrm(s, OPC_MOVQ_VqWq, ret, 0, arg);
            }
        }
        break;

    case TCG_TYPE_V64:
        tcg_debug_assert(ret >= 16 && arg >= 16);
        tcg_out_vex_modrm(s, OPC_MOVQ_VqWq, ret, 0, arg);
        break;
    case TCG_TYPE_V128:
        tcg_debug_assert(ret >= 16 && arg >= 16);
        tcg_out_vex_modrm(s, OPC_MOVDQA_VxWx, ret, 0, arg);
        break;
    case TCG_TYPE_V256:
        tcg_debug_assert(ret >= 16 && arg >= 16);
        tcg_out_vex_modrm(s, OPC_MOVDQA_VxWx | P_VEXL, ret, 0, arg);
        break;

    default:
        g_assert_not_reached();
    }
    return true;
}